

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O0

void __thiscall Corrade::Utility::Error::Error(Error *this,String *output,Flags flags)

{
  long lVar1;
  StringStream *local_60;
  EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)__xff_> local_42;
  undefined1 local_41;
  StringStream *local_40;
  UnderlyingType local_21;
  String *local_20;
  String *output_local;
  Error *this_local;
  Flags flags_local;
  
  local_21 = flags._value;
  local_20 = output;
  output_local = (String *)this;
  this_local._7_1_ = flags._value;
  Debug::Debug(&this->super_Debug,flags);
  lVar1 = __tls_get_addr(&PTR_001f0f78);
  this->_previousGlobalErrorOutput = *(ostream **)(lVar1 + 0x10);
  local_41 = 0;
  if (local_20 == (String *)0x0) {
    local_60 = (StringStream *)0x0;
  }
  else {
    local_60 = (StringStream *)operator_new(0x178);
    local_41 = 1;
    local_40 = local_60;
    StringStream::StringStream(local_60,local_20);
  }
  (this->super_Debug)._output = &local_60->super_ostream;
  lVar1 = __tls_get_addr(&PTR_001f0f78);
  *(StringStream **)(lVar1 + 0x10) = local_60;
  Containers::EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)'\xff'>::EnumSet
            (&local_42,OwnedStream);
  Containers::EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)'\xff'>::operator|=
            (&(this->super_Debug)._internalFlags,local_42);
  return;
}

Assistant:

Error::Error(Containers::String* const output, const Flags flags): Debug{flags} {
    /* Save previous global output and replace it with current one */
    _previousGlobalErrorOutput = debugGlobals.errorOutput;
    /** @todo any better idea how to do these two lines without duplicating
        them in Debug, Warning and Error? */
    debugGlobals.errorOutput = _output = output ? new StringStream{*output} : nullptr;
    _internalFlags |= InternalFlag::OwnedStream;
}